

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CECoordinates.cpp
# Opt level: O0

void CECoordinates::ICRS2Galactic
               (double input_ra,double input_dec,double *glon,double *glat,CEAngleType *angle_type)

{
  int *in_RDX;
  double *in_RSI;
  double *in_RDI;
  double in_XMM0_Qa;
  double in_XMM1_Qa;
  undefined8 local_10;
  undefined8 local_8;
  
  local_10 = in_XMM1_Qa;
  local_8 = in_XMM0_Qa;
  if (*in_RDX == 0) {
    local_8 = in_XMM0_Qa * 0.017453292519943295;
    local_10 = in_XMM1_Qa * 0.017453292519943295;
  }
  iauIcrs2g(local_8,local_10,in_RDI,in_RSI);
  if (*in_RDX == 0) {
    *in_RDI = *in_RDI * 57.29577951308232;
    *in_RSI = *in_RSI * 57.29577951308232;
  }
  return;
}

Assistant:

void CECoordinates::ICRS2Galactic(double input_ra, double input_dec, 
                                  double *glon, double *glat,
                                  const CEAngleType& angle_type)
{
    // Convert to radians if necessary
    if (angle_type == CEAngleType::DEGREES) {
        input_ra *= DD2R ;
        input_dec *= DD2R ;
    }
    
    // Use the sofa method to convert the coordinates
    iauIcrs2g(input_ra, input_dec, glon, glat) ;
    
    // Convert back to degrees if necessary
    if (angle_type == CEAngleType::DEGREES) {
        *glon *= DR2D ;
        *glat *= DR2D ;
    }
}